

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
mxx::scatter_recv<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int root,comm *comm)

{
  size_t size;
  datatype sizedt;
  size_t local_38;
  datatype local_30;
  
  local_30._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
  local_30.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  local_30.builtin = true;
  MPI_Bcast(&local_38,1,&ompi_mpi_unsigned_long,root,comm->mpi_comm);
  scatter_recv<int>(__return_storage_ptr__,local_38,root,comm);
  datatype::~datatype(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter_recv(int root, const mxx::comm& comm = mxx::comm()) {
    size_t size;
    mxx::datatype sizedt = mxx::get_datatype<size_t>();
    MPI_Bcast(&size, 1, sizedt.type(), root, comm);
    // now everybody knows the size
    std::vector<T> result = scatter_recv<T>(size, root, comm);
    return result;
}